

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTiger.cpp
# Opt level: O1

void __thiscall ProblemDecTiger::FillTransitionModel(ProblemDecTiger *this)

{
  TransitionModelDiscrete *pTVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (*(long *)&(this->super_DecPOMDPDiscrete).field_0x220 != 0) {
    uVar6 = 0;
    do {
      if (*(long *)&(this->super_DecPOMDPDiscrete).field_0x220 != 0) {
        uVar7 = 0;
        do {
          lVar2 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                         super_MultiAgentDecisionProcessDiscrete.
                                         super_MultiAgentDecisionProcess + 0x70))(this);
          if (lVar2 != 0) {
            uVar4 = 1;
            do {
              pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                       _m_p_tModel;
              (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel.
                _vptr_TransitionModel[5])(0x3fe0000000000000,pTVar1,uVar6,(ulong)(uVar4 - 1),uVar7);
              uVar5 = (ulong)uVar4;
              uVar3 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                             super_MultiAgentDecisionProcessDiscrete.
                                             super_MultiAgentDecisionProcess + 0x70))(this);
              uVar4 = uVar4 + 1;
            } while (uVar5 < uVar3);
          }
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (uVar7 < *(ulong *)&(this->super_DecPOMDPDiscrete).field_0x220);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < *(ulong *)&(this->super_DecPOMDPDiscrete).field_0x220);
  }
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0x3ff0000000000000,pTVar1,0,0,0);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0,pTVar1,0,0,1);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0x3ff0000000000000,pTVar1,1,0,1);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0,pTVar1,1,0,0);
  return;
}

Assistant:

void ProblemDecTiger::FillTransitionModel()
{
    // add transitions:
    for(Index s1=0; s1<NUMBER_OF_STATES;s1++) 
        for(Index s2=0; s2<NUMBER_OF_STATES;s2++) 
            for(Index ja=0; ja<GetNrJointActions(); ja++)
            {
                if(DEBUG_TM)    cout << "ProblemDecTiger::FillTransitionModel() - calling SetTransitionProbability("<<s1<<", "<<ja<<", "<<s2<<", 0.5)"<<endl;
                SetTransitionProbability(s1, ja, s2, 0.5);
        
                if(DEBUG_TM)    cout << " - GetTransitionProb gives " << GetTransitionProbability(s1, ja, s2) << endl;
            }
    SetTransitionProbability(SLEFT, LISTEN_LISTEN, SLEFT, 1.0);
    SetTransitionProbability(SLEFT, LISTEN_LISTEN, SRIGHT, 0.0);
    SetTransitionProbability(SRIGHT, LISTEN_LISTEN, SRIGHT, 1.0);
    SetTransitionProbability(SRIGHT, LISTEN_LISTEN, SLEFT, 0.0);
}